

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  DIR *pDVar2;
  dirent *pdVar3;
  opj_image_t *poVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 *__ptr;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  char *src;
  char *src_00;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  OPJ_FLOAT64 OVar16;
  OPJ_FLOAT64 OVar17;
  undefined1 auVar18 [16];
  size_t sStackY_a9b0;
  size_t in_stack_ffffffffffff5658;
  long *local_a9a0;
  img_fol_t img_fol;
  raw_cparameters_t local_a978;
  opj_cparameters_t parameters;
  char temp_ofname [4096];
  char image_filename [4096];
  char indexfilename [4096];
  char local_3038 [4096];
  char outfilename [4096];
  char infilename [4096];
  
  OVar16 = opj_clock();
  opj_set_default_encoder_parameters(&parameters);
  indexfilename[0] = '\0';
  img_fol.imgdirpath = (char *)0x0;
  img_fol.out_format = (char *)0x0;
  img_fol.set_imgdir = '\0';
  img_fol.set_out_format = '\0';
  img_fol._18_6_ = 0;
  local_a978.rawComps = (raw_comp_cparameters_t *)0x0;
  local_a978.rawWidth = 0;
  local_a978.rawHeight = 0;
  local_a978.rawComp = 0;
  local_a978.rawBitDepth = 0;
  local_a978.rawSigned = 0;
  parameters.tcp_mct = -1;
  iVar1 = parse_cmdline_encoder
                    (argc,argv,&parameters,&img_fol,&local_a978,indexfilename,
                     in_stack_ffffffffffff5658);
  pcVar13 = img_fol.imgdirpath;
  if (iVar1 == 1) {
    iVar1 = 1;
    __ptr = (undefined8 *)0x0;
    goto LAB_0010403d;
  }
  if (img_fol.set_imgdir != '\x01') {
    local_a9a0._0_4_ = 1;
    __ptr = (undefined8 *)0x0;
    goto LAB_00103865;
  }
  pDVar2 = opendir(img_fol.imgdirpath);
  if (pDVar2 == (DIR *)0x0) {
    uVar14 = 0;
    fprintf(_stderr,"Could not open Folder %s\n",pcVar13);
  }
  else {
    uVar14 = 0;
LAB_0010381d:
    pdVar3 = readdir(pDVar2);
    if (pdVar3 != (dirent *)0x0) {
      if ((byte)pdVar3->d_name[0] == 0x2e) goto code_r0x00103837;
      iVar1 = 0x2e - (uint)(byte)pdVar3->d_name[0];
      goto LAB_00103850;
    }
    closedir(pDVar2);
  }
  uVar8 = (uint)uVar14;
  __ptr = (undefined8 *)malloc(0x10);
  if (__ptr == (undefined8 *)0x0) {
LAB_00103da5:
    pDVar2 = opendir(pcVar13);
    if (pDVar2 == (DIR *)0x0) {
      iVar1 = 0;
      fprintf(_stderr,"Could not open Folder %s\n",pcVar13);
      goto LAB_0010403d;
    }
    fwrite("Folder opened successfully\n",0x1b,1,_stderr);
    lVar11 = 0;
LAB_00103dee:
    pdVar3 = readdir(pDVar2);
    if (pdVar3 != (dirent *)0x0) {
      if ((byte)pdVar3->d_name[0] == 0x2e) goto code_r0x00103e04;
      iVar1 = 0x2e - (uint)(byte)pdVar3->d_name[0];
      goto LAB_00103e1d;
    }
    closedir(pDVar2);
    local_a9a0._0_4_ = uVar8;
    if (uVar8 != 0) {
LAB_00103865:
      lVar15 = 0;
      uVar8 = 0;
      lVar11 = 0;
LAB_00103876:
      if (uVar8 == (uint)local_a9a0) goto LAB_00103ce3;
      fputc(10,_stderr);
      if (img_fol.set_imgdir != '\x01') goto LAB_0010389e;
      memset(local_3038,0,0x1000);
      strcpy(image_filename,*(char **)(__ptr[1] + (long)(int)uVar8 * 8));
      fprintf(_stderr,"File Number %d \"%s\"\n",(ulong)uVar8,image_filename);
      parameters.decod_format = get_file_format(image_filename);
      pcVar13 = img_fol.imgdirpath;
      if (parameters.decod_format == -1) {
switchD_001038bf_caseD_d:
        fwrite("skipping file...\n",0x11,1,_stderr);
        goto LAB_00103ae8;
      }
      sprintf(infilename,"%s/%s",img_fol.imgdirpath,image_filename);
      iVar1 = opj_strcpy_s(parameters.infile,(size_t)infilename,src);
      if (iVar1 != 0) goto switchD_001038bf_caseD_d;
      pcVar6 = strtok(image_filename,".");
      strcpy(temp_ofname,pcVar6);
      while (pcVar6 = strtok((char *)0x0,"."), pcVar6 != (char *)0x0) {
        strcat(temp_ofname,local_3038);
        sprintf(local_3038,".%s",pcVar6);
      }
      if (img_fol.set_out_format == '\x01') {
        sprintf(outfilename,"%s/%s.%s",pcVar13,temp_ofname,img_fol.out_format);
        iVar1 = opj_strcpy_s(parameters.outfile,(size_t)outfilename,src_00);
        if (iVar1 != 0) goto switchD_001038bf_caseD_d;
      }
LAB_0010389e:
      switch(parameters.decod_format) {
      case 10:
        poVar4 = pnmtoimage(parameters.infile,&parameters);
        if (poVar4 == (opj_image_t *)0x0) {
          pcVar13 = "Unable to load pnm file\n";
          break;
        }
        goto LAB_001039aa;
      case 0xb:
        poVar4 = pgxtoimage(parameters.infile,&parameters);
        if (poVar4 != (opj_image_t *)0x0) goto LAB_001039aa;
        pcVar13 = "Unable to load pgx file\n";
        break;
      case 0xc:
        poVar4 = bmptoimage(parameters.infile,&parameters);
        if (poVar4 != (opj_image_t *)0x0) goto LAB_001039aa;
        pcVar13 = "Unable to load bmp file\n";
        break;
      default:
        goto switchD_001038bf_caseD_d;
      case 0xe:
        poVar4 = tiftoimage(parameters.infile,&parameters);
        if (poVar4 != (opj_image_t *)0x0) goto LAB_001039aa;
        pcVar13 = "Unable to load tiff file\n";
        sStackY_a9b0 = 0x19;
        goto LAB_00104031;
      case 0xf:
        poVar4 = rawtoimage(parameters.infile,&parameters,&local_a978);
        goto LAB_00103911;
      case 0x10:
        poVar4 = tgatoimage(parameters.infile,&parameters);
        if (poVar4 != (opj_image_t *)0x0) goto LAB_001039aa;
        pcVar13 = "Unable to load tga file\n";
        break;
      case 0x11:
        poVar4 = pngtoimage(parameters.infile,&parameters);
        if (poVar4 != (opj_image_t *)0x0) goto LAB_001039aa;
        pcVar13 = "Unable to load png file\n";
        break;
      case 0x12:
        poVar4 = rawltoimage(parameters.infile,&parameters,&local_a978);
LAB_00103911:
        if (poVar4 == (opj_image_t *)0x0) {
          pcVar13 = "Unable to load raw file\n";
          break;
        }
LAB_001039aa:
        if (parameters.tcp_mct == '\x01') {
          if (2 < poVar4->numcomps) goto LAB_001039d9;
          fwrite("RGB->YCC conversion cannot be used:\n",0x24,1,_stderr);
          pcVar13 = "Input image has less than 3 components\n";
          sStackY_a9b0 = 0x27;
          goto LAB_00104031;
        }
        if (parameters.tcp_mct == -1) {
          parameters.tcp_mct = 2 < poVar4->numcomps;
        }
        else {
LAB_001039d9:
          if ((parameters.tcp_mct == '\x02') && (parameters.mct_data == (void *)0x0)) {
            fwrite("Custom MCT has been set but no array-based MCT\n",0x2f,1,_stderr);
            pcVar13 = "has been provided. Aborting.\n";
            sStackY_a9b0 = 0x1d;
            goto LAB_00104031;
          }
        }
        iVar1 = parameters.cod_format;
        if (parameters.cod_format == 0) {
LAB_00103a03:
          uVar5 = opj_create_compress(iVar1);
          opj_set_info_handler(uVar5,info_callback,0);
          opj_set_warning_handler(uVar5,warning_callback,0);
          opj_set_error_handler(uVar5,error_callback,0);
          iVar1 = opj_setup_encoder(uVar5,&parameters,poVar4);
          if (iVar1 == 0) {
            fwrite("failed to encode image: opj_setup_encoder\n",0x2a,1,_stderr);
            opj_destroy_codec(uVar5);
            opj_image_destroy(poVar4);
          }
          else {
            lVar11 = opj_stream_create_default_file_stream(parameters.outfile,0);
            if (lVar11 != 0) {
              iVar1 = opj_start_compress(uVar5,poVar4,lVar11);
              if (iVar1 == 0) {
                fwrite("failed to encode image: opj_start_compress\n",0x2b,1,_stderr);
LAB_00103ea7:
                fwrite("failed to encode image: opj_encode\n",0x23,1,_stderr);
              }
              else {
                iVar1 = opj_encode(uVar5,lVar11);
                if (iVar1 == 0) goto LAB_00103ea7;
                iVar1 = opj_end_compress(uVar5,lVar11);
                if (iVar1 != 0) {
                  lVar15 = lVar15 + 1;
                  fprintf(_stdout,"[INFO] Generated outfile %s\n",parameters.outfile);
                  opj_stream_destroy(lVar11);
                  opj_destroy_codec(uVar5);
                  opj_image_destroy(poVar4);
                  goto LAB_00103ae8;
                }
              }
              fwrite("failed to encode image: opj_end_compress\n",0x29,1,_stderr);
              opj_stream_destroy(lVar11);
              opj_destroy_codec(uVar5);
              opj_image_destroy(poVar4);
              fwrite("failed to encode image\n",0x17,1,_stderr);
              remove(parameters.outfile);
            }
          }
          goto LAB_00104036;
        }
        if (parameters.cod_format == 1) {
          iVar1 = 2;
          goto LAB_00103a03;
        }
        fwrite("skipping file..\n",0x10,1,_stderr);
        opj_stream_destroy(lVar11);
LAB_00103ae8:
        uVar8 = uVar8 + 1;
        goto LAB_00103876;
      }
      sStackY_a9b0 = 0x18;
LAB_00104031:
      fwrite(pcVar13,sStackY_a9b0,1,_stderr);
LAB_00104036:
      iVar1 = 1;
      goto LAB_0010403d;
    }
    fwrite("Folder is empty\n",0x10,1,_stdout);
  }
  else {
    pvVar7 = malloc((ulong)(uVar8 << 0xc));
    *__ptr = pvVar7;
    local_a9a0 = (long *)malloc(uVar14 * 8);
    __ptr[1] = local_a9a0;
    if (pvVar7 != (void *)0x0) {
      plVar10 = local_a9a0;
      for (uVar12 = 0; uVar14 << 0xc != uVar12; uVar12 = uVar12 + 0x1000) {
        *plVar10 = (uVar12 & 0xffffffff) + (long)pvVar7;
        plVar10 = plVar10 + 1;
      }
      goto LAB_00103da5;
    }
  }
  iVar1 = 0;
LAB_0010403d:
  free(parameters.cp_comment);
  free(parameters.cp_matrice);
  free(local_a978.rawComps);
  free(img_fol.imgdirpath);
  if (__ptr != (undefined8 *)0x0) {
    free((void *)*__ptr);
    free((void *)__ptr[1]);
    free(__ptr);
  }
  return iVar1;
code_r0x00103837:
  if (pdVar3->d_name[1] != 0) {
    uVar8 = (byte)pdVar3->d_name[1] - 0x2e;
    if (uVar8 == 0) {
      uVar8 = (uint)(byte)pdVar3->d_name[2];
    }
    iVar1 = -uVar8;
LAB_00103850:
    if (iVar1 != 0) {
      uVar14 = (ulong)((int)uVar14 + 1);
    }
  }
  goto LAB_0010381d;
code_r0x00103e04:
  if (pdVar3->d_name[1] != 0) {
    uVar9 = (byte)pdVar3->d_name[1] - 0x2e;
    if (uVar9 == 0) {
      uVar9 = (uint)(byte)pdVar3->d_name[2];
    }
    iVar1 = -uVar9;
LAB_00103e1d:
    if (iVar1 != 0) {
      strcpy((char *)local_a9a0[lVar11],pdVar3->d_name);
      lVar11 = lVar11 + 1;
    }
  }
  goto LAB_00103dee;
LAB_00103ce3:
  OVar17 = opj_clock();
  if (lVar15 == 0) {
    iVar1 = 0;
  }
  else {
    auVar18._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar18._0_8_ = lVar15;
    auVar18._12_4_ = 0x45300000;
    iVar1 = 0;
    fprintf(_stdout,"encode time: %d ms \n",
            (ulong)(uint)(int)((((double)OVar17 - (double)OVar16) * 1000.0) /
                              ((auVar18._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0))));
  }
  goto LAB_0010403d;
}

Assistant:

int main(int argc, char **argv)
{

    opj_cparameters_t parameters;   /* compression parameters */

    opj_stream_t *l_stream = 00;
    opj_codec_t* l_codec = 00;
    opj_image_t *image = NULL;
    raw_cparameters_t raw_cp;
    OPJ_SIZE_T num_compressed_files = 0;

    char indexfilename[OPJ_PATH_LEN];   /* index file name */

    unsigned int i, num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    int ret = 0;

    OPJ_BOOL bSuccess;
    OPJ_BOOL bUseTiles = OPJ_FALSE; /* OPJ_TRUE */
    OPJ_UINT32 l_nb_tiles = 4;
    OPJ_FLOAT64 t = opj_clock();

    /* set encoding parameters to default values */
    opj_set_default_encoder_parameters(&parameters);

    /* Initialize indexfilename and img_fol */
    *indexfilename = 0;
    memset(&img_fol, 0, sizeof(img_fol_t));

    /* raw_cp initialization */
    raw_cp.rawBitDepth = 0;
    raw_cp.rawComp = 0;
    raw_cp.rawComps = 0;
    raw_cp.rawHeight = 0;
    raw_cp.rawSigned = 0;
    raw_cp.rawWidth = 0;

    /* parse input and get user encoding parameters */
    parameters.tcp_mct = (char)
                         255; /* This will be set later according to the input image or the provided option */
    if (parse_cmdline_encoder(argc, argv, &parameters, &img_fol, &raw_cp,
                              indexfilename, sizeof(indexfilename)) == 1) {
        ret = 1;
        goto fin;
    }

    /* Read directory if necessary */
    if (img_fol.set_imgdir == 1) {
        num_images = get_num_images(img_fol.imgdirpath);
        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (dirptr) {
            dirptr->filename_buf = (char*)malloc(num_images * OPJ_PATH_LEN * sizeof(
                    char)); /* Stores at max 10 image file names*/
            dirptr->filename = (char**) malloc(num_images * sizeof(char*));
            if (!dirptr->filename_buf) {
                ret = 0;
                goto fin;
            }
            for (i = 0; i < num_images; i++) {
                dirptr->filename[i] = dirptr->filename_buf + i * OPJ_PATH_LEN;
            }
        }
        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            ret = 0;
            goto fin;
        }
        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            ret = 0;
            goto fin;
        }
    } else {
        num_images = 1;
    }
    /*Encoding image one by one*/
    for (imageno = 0; imageno < num_images; imageno++) {
        image = NULL;
        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file((int)imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        switch (parameters.decod_format) {
        case PGX_DFMT:
            break;
        case PXM_DFMT:
            break;
        case BMP_DFMT:
            break;
        case TIF_DFMT:
            break;
        case RAW_DFMT:
        case RAWL_DFMT:
            break;
        case TGA_DFMT:
            break;
        case PNG_DFMT:
            break;
        default:
            fprintf(stderr, "skipping file...\n");
            continue;
        }

        /* decode the source image */
        /* ----------------------- */

        switch (parameters.decod_format) {
        case PGX_DFMT:
            image = pgxtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pgx file\n");
                ret = 1;
                goto fin;
            }
            break;

        case PXM_DFMT:
            image = pnmtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pnm file\n");
                ret = 1;
                goto fin;
            }
            break;

        case BMP_DFMT:
            image = bmptoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load bmp file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBTIFF
        case TIF_DFMT:
            image = tiftoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tiff file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBTIFF */

        case RAW_DFMT:
            image = rawtoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case RAWL_DFMT:
            image = rawltoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case TGA_DFMT:
            image = tgatoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tga file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBPNG
        case PNG_DFMT:
            image = pngtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load png file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBPNG */
        }

        /* Can happen if input file is TIFF or PNG
        * and OPJ_HAVE_LIBTIF or OPJ_HAVE_LIBPNG is undefined
        */
        if (!image) {
            fprintf(stderr, "Unable to load file: got no image\n");
            ret = 1;
            goto fin;
        }

        /* Decide if MCT should be used */
        if (parameters.tcp_mct == (char)
                255) { /* mct mode has not been set in commandline */
            parameters.tcp_mct = (image->numcomps >= 3) ? 1 : 0;
        } else {            /* mct mode has been set in commandline */
            if ((parameters.tcp_mct == 1) && (image->numcomps < 3)) {
                fprintf(stderr, "RGB->YCC conversion cannot be used:\n");
                fprintf(stderr, "Input image has less than 3 components\n");
                ret = 1;
                goto fin;
            }
            if ((parameters.tcp_mct == 2) && (!parameters.mct_data)) {
                fprintf(stderr, "Custom MCT has been set but no array-based MCT\n");
                fprintf(stderr, "has been provided. Aborting.\n");
                ret = 1;
                goto fin;
            }
        }

        /* encode the destination image */
        /* ---------------------------- */

        switch (parameters.cod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_JP2);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        if (bUseTiles) {
            parameters.cp_tx0 = 0;
            parameters.cp_ty0 = 0;
            parameters.tile_size_on = OPJ_TRUE;
            parameters.cp_tdx = 512;
            parameters.cp_tdy = 512;
        }
        if (! opj_setup_encoder(l_codec, &parameters, image)) {
            fprintf(stderr, "failed to encode image: opj_setup_encoder\n");
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            ret = 1;
            goto fin;
        }

        /* open a byte stream for writing and allocate memory for all tiles */
        l_stream = opj_stream_create_default_file_stream(parameters.outfile, OPJ_FALSE);
        if (! l_stream) {
            ret = 1;
            goto fin;
        }

        /* encode the image */
        bSuccess = opj_start_compress(l_codec, image, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_start_compress\n");
        }
        if (bSuccess && bUseTiles) {
            OPJ_BYTE *l_data;
            OPJ_UINT32 l_data_size = 512 * 512 * 3;
            l_data = (OPJ_BYTE*) calloc(1, l_data_size);
            if (l_data == NULL) {
                ret = 1;
                goto fin;
            }
            for (i = 0; i < l_nb_tiles; ++i) {
                if (! opj_write_tile(l_codec, i, l_data, l_data_size, l_stream)) {
                    fprintf(stderr, "ERROR -> test_tile_encoder: failed to write the tile %d!\n",
                            i);
                    opj_stream_destroy(l_stream);
                    opj_destroy_codec(l_codec);
                    opj_image_destroy(image);
                    ret = 1;
                    goto fin;
                }
            }
            free(l_data);
        } else {
            bSuccess = bSuccess && opj_encode(l_codec, l_stream);
            if (!bSuccess)  {
                fprintf(stderr, "failed to encode image: opj_encode\n");
            }
        }
        bSuccess = bSuccess && opj_end_compress(l_codec, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_end_compress\n");
        }

        if (!bSuccess)  {
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fprintf(stderr, "failed to encode image\n");
            remove(parameters.outfile);
            ret = 1;
            goto fin;
        }

        num_compressed_files++;
        fprintf(stdout, "[INFO] Generated outfile %s\n", parameters.outfile);
        /* close and free the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining compression structures */
        opj_destroy_codec(l_codec);

        /* free image data */
        opj_image_destroy(image);

    }

    t = opj_clock() - t;
    if (num_compressed_files) {
        fprintf(stdout, "encode time: %d ms \n",
                (int)((t * 1000.0) / (OPJ_FLOAT64)num_compressed_files));
    }

    ret = 0;

fin:
    if (parameters.cp_comment) {
        free(parameters.cp_comment);
    }
    if (parameters.cp_matrice) {
        free(parameters.cp_matrice);
    }
    if (raw_cp.rawComps) {
        free(raw_cp.rawComps);
    }
    if (img_fol.imgdirpath) {
        free(img_fol.imgdirpath);
    }
    if (dirptr) {
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        free(dirptr);
    }
    return ret;
}